

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralLinearActionVarying::IfcStructuralLinearActionVarying
          (IfcStructuralLinearActionVarying *this)

{
  *(undefined ***)&this->field_0x1d8 = &PTR__Object_007331c0;
  *(undefined8 *)&this->field_0x1e0 = 0;
  *(char **)&this->field_0x1e8 = "IfcStructuralLinearActionVarying";
  IfcStructuralLinearAction::IfcStructuralLinearAction
            (&this->super_IfcStructuralLinearAction,&PTR_construction_vtable_24__007e01a0);
  *(undefined8 *)&(this->super_IfcStructuralLinearAction).field_0x1b0 = 0;
  *(undefined8 *)
   &(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.super_IfcStructuralActivity.
    super_IfcProduct.super_IfcObject = 0x7e0048;
  *(undefined8 *)&this->field_0x1d8 = 0x7e0188;
  *(undefined8 *)
   &(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.super_IfcStructuralActivity.
    super_IfcProduct.super_IfcObject.field_0x88 = 0x7e0070;
  (this->super_IfcStructuralLinearAction).super_IfcStructuralAction.super_IfcStructuralActivity.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x7e0098;
  *(undefined8 *)
   &(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.super_IfcStructuralActivity.
    super_IfcProduct.super_IfcObject.field_0xd0 = 0x7e00c0;
  *(undefined8 *)
   &(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.super_IfcStructuralActivity.
    super_IfcProduct.field_0x100 = 0x7e00e8;
  *(undefined8 *)
   &(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.super_IfcStructuralActivity.
    field_0x138 = 0x7e0110;
  *(undefined8 *)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.field_0x178 =
       0x7e0138;
  *(undefined8 *)&(this->super_IfcStructuralLinearAction).field_0x1a8 = 0x7e0160;
  *(undefined8 *)&(this->super_IfcStructuralLinearAction).field_0x1b8 = 0;
  (this->SubsequentAppliedLoads).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SubsequentAppliedLoads).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SubsequentAppliedLoads).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

IfcStructuralLinearActionVarying() : Object("IfcStructuralLinearActionVarying") {}